

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_3983::test_iterator_create_last(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  roaring64_iterator_t *prVar2;
  uint64_t uVar3;
  
  r = roaring64_bitmap_create();
  prVar2 = roaring64_iterator_create_last(r);
  _Var1 = roaring64_iterator_has_value(prVar2);
  _assert_true((ulong)!_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5cd);
  roaring64_iterator_free(prVar2);
  roaring64_bitmap_add(r,0);
  prVar2 = roaring64_iterator_create_last(r);
  _Var1 = roaring64_iterator_has_value(prVar2);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5d3);
  uVar3 = roaring64_iterator_value(prVar2);
  _assert_int_equal(uVar3,0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x5d4);
  roaring64_iterator_free(prVar2);
  roaring64_bitmap_add(r,0x100000004d2);
  prVar2 = roaring64_iterator_create_last(r);
  _Var1 = roaring64_iterator_has_value(prVar2);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5da);
  uVar3 = roaring64_iterator_value(prVar2);
  _assert_int_equal(uVar3,0x100000004d2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x5db);
  roaring64_iterator_free(prVar2);
  roaring64_bitmap_remove(r,0);
  prVar2 = roaring64_iterator_create_last(r);
  _Var1 = roaring64_iterator_has_value(prVar2);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5e1);
  uVar3 = roaring64_iterator_value(prVar2);
  _assert_int_equal(uVar3,0x100000004d2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x5e2);
  roaring64_iterator_free(prVar2);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_create_last) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    {
        roaring64_iterator_t* it = roaring64_iterator_create_last(r);
        assert_false(roaring64_iterator_has_value(it));
        roaring64_iterator_free(it);
    }
    roaring64_bitmap_add(r, 0);
    {
        roaring64_iterator_t* it = roaring64_iterator_create_last(r);
        assert_true(roaring64_iterator_has_value(it));
        assert_int_equal(roaring64_iterator_value(it), 0);
        roaring64_iterator_free(it);
    }
    roaring64_bitmap_add(r, (1ULL << 40) + 1234);
    {
        roaring64_iterator_t* it = roaring64_iterator_create_last(r);
        assert_true(roaring64_iterator_has_value(it));
        assert_int_equal(roaring64_iterator_value(it), ((1ULL << 40) + 1234));
        roaring64_iterator_free(it);
    }
    roaring64_bitmap_remove(r, 0);
    {
        roaring64_iterator_t* it = roaring64_iterator_create_last(r);
        assert_true(roaring64_iterator_has_value(it));
        assert_int_equal(roaring64_iterator_value(it), ((1ULL << 40) + 1234));
        roaring64_iterator_free(it);
    }
    roaring64_bitmap_free(r);
}